

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::getTargetLayers
              (LayeredRenderTargetType target)

{
  int local_c;
  LayeredRenderTargetType target_local;
  
  switch(target) {
  case TARGET_CUBE:
    local_c = 6;
    break;
  case TARGET_3D:
    local_c = 4;
    break;
  case TARGET_1D_ARRAY:
    local_c = 4;
    break;
  case TARGET_2D_ARRAY:
    local_c = 4;
    break;
  case TARGET_2D_MS_ARRAY:
    local_c = 2;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int LayeredRenderCase::getTargetLayers (LayeredRenderTargetType target)
{
	switch (target)
	{
		case TARGET_CUBE:			return 6;
		case TARGET_3D:				return 4;
		case TARGET_1D_ARRAY:		return 4;
		case TARGET_2D_ARRAY:		return 4;
		case TARGET_2D_MS_ARRAY:	return 2;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}